

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_reset_outgoing_commands(ENetList *queue)

{
  void *memory;
  ENetOutgoingCommand *outgoingCommand;
  ENetList *queue_local;
  
  while ((queue->sentinel).next != &queue->sentinel) {
    memory = enet_list_remove((queue->sentinel).next);
    if ((*(long *)((long)memory + 0x58) != 0) &&
       (*(int *)(*(long *)((long)memory + 0x58) + 0x18) =
             *(int *)(*(long *)((long)memory + 0x58) + 0x18) + -1,
       *(int *)(*(long *)((long)memory + 0x58) + 0x18) == 0)) {
      enet_packet_destroy(*(ENetPacket **)((long)memory + 0x58));
    }
    enet_free(memory);
  }
  return;
}

Assistant:

static void enet_peer_reset_outgoing_commands(ENetList* queue) {
	ENetOutgoingCommand* outgoingCommand;

	while (!enet_list_empty(queue)) {
		outgoingCommand = (ENetOutgoingCommand*)enet_list_remove(enet_list_begin(queue));

		if (outgoingCommand->packet != NULL) {
			--outgoingCommand->packet->referenceCount;

			if (outgoingCommand->packet->referenceCount == 0)
				enet_packet_destroy(outgoingCommand->packet);
		}

		enet_free(outgoingCommand);
	}
}